

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

int SHA1_Update(SHA_CTX *c,void *data,size_t len)

{
  void *pvVar1;
  uint uVar2;
  ulong uVar3;
  size_t __n;
  size_t sVar4;
  ulong uVar5;
  
  uVar5 = len * 8;
  uVar2 = (int)uVar5 + c->Nl;
  uVar3 = (ulong)(c->Nl >> 3 & 0x3f);
  c->Nl = uVar2;
  if (uVar2 <= uVar5 && uVar5 - uVar2 != 0) {
    c->Nh = c->Nh + 1;
  }
  c->Nh = c->Nh + (int)(len >> 0x1d);
  if (len + uVar3 < 0x40) {
    __n = 0;
  }
  else {
    __n = 0x40 - uVar3;
    memcpy((void *)((long)c->data + uVar3),data,__n);
    SHA1Transform(&c->h0,(uint8_t *)c->data);
    if ((uVar3 ^ 0x7f) < len) {
      uVar3 = 0;
      sVar4 = __n;
      do {
        SHA1Transform(&c->h0,(uint8_t *)((long)data + sVar4));
        __n = sVar4 + 0x40;
        uVar5 = sVar4 + 0x7f;
        sVar4 = __n;
      } while (uVar5 < len);
    }
    else {
      uVar3 = 0;
    }
  }
  pvVar1 = memcpy((void *)((long)c->data + uVar3),(void *)((long)data + __n),len - __n);
  return (int)pvVar1;
}

Assistant:

void SHA1_Update(SHA1_CTX *context, const uint8_t *data, size_t len)
{
  size_t i, j;

  j = (context->count[0] >> 3) & 63;
  if ((context->count[0] += len << 3) < (len << 3))
    context->count[1]++;
  context->count[1] += (len >> 29);
  if ((j + len) > 63) {
    memcpy(&context->buffer[j], data, (i = 64 - j));
    SHA1Transform(context->state, context->buffer);
    for (; i + 63 < len; i += 64)
      SHA1Transform(context->state, &data[i]);
    j = 0;
  } else
    i = 0;
  memcpy(&context->buffer[j], &data[i], len - i);
}